

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProgramInterfaces.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderProgramInterfaces::deinit(TessellationShaderProgramInterfaces *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_shader_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_tc_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_tc_shader_id = 0;
  }
  if (this->m_te_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_te_shader_id = 0;
  }
  if (this->m_vs_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_shader_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderProgramInterfaces::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	/* Release all objects we might've created */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_shader_id != 0)
	{
		gl.deleteShader(m_fs_shader_id);

		m_fs_shader_id = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_tc_shader_id != 0)
	{
		gl.deleteShader(m_tc_shader_id);

		m_tc_shader_id = 0;
	}

	if (m_te_shader_id != 0)
	{
		gl.deleteShader(m_te_shader_id);

		m_te_shader_id = 0;
	}

	if (m_vs_shader_id != 0)
	{
		gl.deleteShader(m_vs_shader_id);

		m_vs_shader_id = 0;
	}
}